

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = ZSTD_checkCParams(cparams);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_windowLog,cparams.windowLog);
    if (sVar1 < 0xffffffffffffff89) {
      sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_chainLog,cparams.chainLog);
      if (sVar1 < 0xffffffffffffff89) {
        sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_hashLog,cparams.hashLog);
        if (sVar1 < 0xffffffffffffff89) {
          sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_searchLog,cparams.searchLog);
          if (sVar1 < 0xffffffffffffff89) {
            sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_minMatch,cparams.minMatch);
            if (sVar1 < 0xffffffffffffff89) {
              sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_targetLength,cparams.targetLength);
              if (sVar1 < 0xffffffffffffff89) {
                sVar2 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_strategy,cparams.strategy);
                sVar1 = 0;
                if (0xffffffffffffff88 < sVar2) {
                  sVar1 = sVar2;
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}